

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexerHelper.cxx
# Opt level: O1

void __thiscall
cmCTestResourceGroupsLexerHelper::WriteProcess(cmCTestResourceGroupsLexerHelper *this)

{
  uint uVar1;
  
  if (this->ProcessCount != 0) {
    uVar1 = 0;
    do {
      std::
      vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
      ::push_back(this->Output,&this->Process);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->ProcessCount);
  }
  std::
  vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
  ::_M_erase_at_end(&this->Process,
                    (this->Process).
                    super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->ProcessCount = 1;
  return;
}

Assistant:

void cmCTestResourceGroupsLexerHelper::WriteProcess()
{
  for (unsigned int i = 0; i < this->ProcessCount; ++i) {
    this->Output.push_back(this->Process);
  }
  this->Process.clear();
  this->ProcessCount = 1;
}